

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::
Attribute_Access<chaiscript::Boxed_Value,_std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
::do_call(Attribute_Access<chaiscript::Boxed_Value,_std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
          *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Type_Conversions *this_00;
  Boxed_Value *pBVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer pTVar3;
  pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *ppVar4;
  Boxed_Value *in_RCX;
  Boxed_Value BVar5;
  
  this_00 = (t_conversions->m_conversions)._M_data;
  if ((*(byte *)((this_00->m_mutex)._M_impl._M_rwlock.__align + 0x10) & 1) == 0) {
    ppVar4 = boxed_cast<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>*>
                       ((chaiscript *)this_00,in_RCX,t_conversions);
  }
  else {
    ppVar4 = boxed_cast<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>const*>
                       ((chaiscript *)this_00,in_RCX,t_conversions);
  }
  pBVar1 = params[4].m_begin;
  _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(pBVar1->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr +
                 (long)&(ppVar4->first).m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base = (_func_int **)_Var2._M_pi;
  pTVar3 = *(pointer *)
            ((long)&(pBVar1->m_data).
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + (long)&(ppVar4->first).m_data);
  (this->super_Proxy_Function_Base).m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar3;
  if (pTVar3 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&pTVar3->m_bare_type_info = *(int *)&pTVar3->m_bare_type_info + 1;
      UNLOCK();
    }
    else {
      *(int *)&pTVar3->m_bare_type_info = *(int *)&pTVar3->m_bare_type_info + 1;
    }
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }